

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O1

Am_Wrapper * Am_Compute_MG_Feedback_Object_proc(Am_Object *self)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Object *prev;
  Am_Wrapper *pAVar4;
  Am_Object feedback;
  Am_Object owner;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  
  local_40.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Object(&local_38,(Am_Slot_Key)self,10);
  pAVar3 = Am_Object::Get(self,0xdb,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
  pAVar3 = Am_Object::Get(&local_38,bVar1 ^ 0x1df,0);
  Am_Object::operator=(&local_40,pAVar3);
  bVar2 = Am_Object::Valid(&local_40);
  if (bVar2) {
    Am_Object::Get_Object(&local_20,(Am_Slot_Key)&local_40,0x193);
    bVar2 = Am_Object::operator!=(&local_20,&local_38);
    Am_Object::~Am_Object(&local_20);
  }
  else {
    bVar2 = false;
  }
  if (bVar2 != false) {
    Am_Object::Create(&local_28,(char *)&local_40);
    prev = Am_Object::Set(&local_28,0x69,false,0);
    Am_Object::operator=(&local_40,prev);
    Am_Object::~Am_Object(&local_28);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_38);
    Am_Object::Set(&local_40,0x193,pAVar4,0);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_40);
    Am_Object::Set(&local_38,bVar1 ^ 0x1df,pAVar4,0);
    Am_Object::Am_Object(&local_30,&local_40);
    Am_Object::Add_Part(&local_38,&local_30,false,0);
    Am_Object::~Am_Object(&local_30);
  }
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_40);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_40);
  return pAVar4;
}

Assistant:

Am_Define_Object_Formula(Am_Compute_MG_Feedback_Object)
{
  Am_Object feedback;
  Am_Object owner = self.Get_Owner();
  bool as_line = self.Get(Am_AS_LINE);
  feedback =
      owner.Get(as_line ? Am_LINE_FEEDBACK_OBJECT : Am_RECT_FEEDBACK_OBJECT);
  if (feedback.Valid() &&
      feedback.Get_Object(Am_OPERATES_ON, Am_NO_DEPENDENCY) != owner) {
    feedback = feedback.Create().Set(Am_VISIBLE, false);
    feedback.Set(Am_OPERATES_ON, owner);
    owner.Set(as_line ? Am_LINE_FEEDBACK_OBJECT : Am_RECT_FEEDBACK_OBJECT,
              feedback);
    owner.Add_Part(feedback, false);
  }
  return feedback;
}